

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O2

int __thiscall ModuleWriter::verifyAndWriteModule(ModuleWriter *this)

{
  bool bVar1;
  raw_ostream *prVar2;
  char *Str;
  
  bVar1 = verifyModule(this);
  if (bVar1) {
    bVar1 = writeModule(this);
    if (bVar1) {
      return 0;
    }
    Str = "Saving sliced module failed\n";
  }
  else {
    prVar2 = (raw_ostream *)llvm::errs();
    llvm::raw_ostream::operator<<
              (prVar2,"[llvm-slicer] ERROR: Verifying module failed, the IR is not valid\n");
    Str = "[llvm-slicer] Saving anyway so that you can check it\n";
  }
  prVar2 = (raw_ostream *)llvm::errs();
  llvm::raw_ostream::operator<<(prVar2,Str);
  return 1;
}

Assistant:

int verifyAndWriteModule() {
        if (!verifyModule()) {
            llvm::errs() << "[llvm-slicer] ERROR: Verifying module failed, the "
                            "IR is not valid\n";
            llvm::errs()
                    << "[llvm-slicer] Saving anyway so that you can check it\n";
            return 1;
        }

        if (!writeModule()) {
            llvm::errs() << "Saving sliced module failed\n";
            return 1;
        }

        // exit code
        return 0;
    }